

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setLineEdit(QComboBox *this,QLineEdit *edit)

{
  bool bVar1;
  QComboBoxPrivate *this_00;
  QWidgetPrivate *pQVar2;
  QObject *pQVar3;
  QCompleter *pQVar4;
  Object *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QCompleter *completer;
  QComboBoxPrivate *d;
  QString *in_stack_fffffffffffffe08;
  QLineEdit *in_stack_fffffffffffffe10;
  QLineEdit *this_01;
  undefined4 in_stack_fffffffffffffe18;
  CompletionMode in_stack_fffffffffffffe1c;
  QWidget *in_stack_fffffffffffffe20;
  QWidget *in_stack_fffffffffffffe28;
  QAbstractItemModel *model;
  QWidget *in_stack_fffffffffffffe30;
  QCompleter *this_02;
  QComboBoxPrivate *this_03;
  QCompleter *c;
  offset_in_QComboBox_to_subr *in_stack_fffffffffffffe50;
  QComboBox *this_04;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 uVar5;
  Object *in_stack_fffffffffffffe60;
  ConnectionType type;
  QWidget *w;
  Object *in_stack_fffffffffffffe68;
  code *receiverPrivate;
  Object *this_05;
  Object *sender;
  QWidget *this_06;
  Function in_stack_fffffffffffffe90;
  offset_in_QLineEdit_to_subr in_stack_fffffffffffffea0;
  code *signal;
  Connection local_d8;
  Object *local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined8 uStack_68;
  undefined1 local_60 [16];
  undefined8 uStack_50;
  QAbstractItemModel local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QComboBox *)0x53841e);
  if (in_RSI == (Object *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe20,
               (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
               (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),(char *)in_stack_fffffffffffffe08);
    QMessageLogger::warning(local_28,"QComboBox::setLineEdit: cannot set a 0 line edit");
  }
  else if (in_RSI != (Object *)this_00->lineEdit) {
    sender = in_RSI;
    currentText((QComboBox *)in_stack_fffffffffffffe28);
    QLineEdit::setText(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    QString::~QString((QString *)0x5384cb);
    this_06 = &this_00->lineEdit->super_QWidget;
    if (this_06 != (QWidget *)0x0) {
      (**(code **)(*(long *)this_06 + 0x20))();
    }
    this_00->lineEdit = (QLineEdit *)in_RSI;
    pQVar2 = qt_widget_private((QWidget *)0x53851b);
    *(uint *)&pQVar2->field_0x250 = *(uint *)&pQVar2->field_0x250 & 0xfbffffff | 0x4000000;
    pQVar3 = QObject::parent((QObject *)0x538547);
    if (pQVar3 != in_RDI) {
      QWidget::setParent(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    local_60._8_8_ = QComboBoxPrivate::returnPressed;
    uStack_50 = 0;
    model = local_48;
    uVar5 = 0;
    QObjectPrivate::connect<void(QLineEdit::*)(),void(QComboBoxPrivate::*)()>
              ((Object *)sender,in_stack_fffffffffffffea0,in_stack_fffffffffffffe68,
               in_stack_fffffffffffffe90,(ConnectionType)((ulong)in_stack_fffffffffffffe60 >> 0x20))
    ;
    QMetaObject::Connection::~Connection((Connection *)model);
    local_78._8_8_ = QComboBoxPrivate::editingFinished;
    uStack_68 = 0;
    this_02 = (QCompleter *)local_60;
    QObjectPrivate::connect<void(QLineEdit::*)(),void(QComboBoxPrivate::*)()>
              ((Object *)sender,in_stack_fffffffffffffea0,in_stack_fffffffffffffe68,
               in_stack_fffffffffffffe90,(ConnectionType)((ulong)in_stack_fffffffffffffe60 >> 0x20))
    ;
    QMetaObject::Connection::~Connection((Connection *)this_02);
    local_90._8_8_ = editTextChanged;
    local_80 = 0;
    this_03 = (QComboBoxPrivate *)local_78;
    QObject::connect<void(QLineEdit::*)(QString_const&),void(QComboBox::*)(QString_const&)>
              (in_stack_fffffffffffffe60,(offset_in_QLineEdit_to_subr)in_RDI,
               (ContextType *)CONCAT44(uVar5,in_stack_fffffffffffffe58),in_stack_fffffffffffffe50,
               (ConnectionType)in_stack_fffffffffffffea0);
    QMetaObject::Connection::~Connection((Connection *)this_03);
    local_a8._8_8_ = currentTextChanged;
    local_98._0_1_ = (QPaintDevice)0x0;
    local_98._1_7_ = 0;
    c = (QCompleter *)local_90;
    QObject::connect<void(QLineEdit::*)(QString_const&),void(QComboBox::*)(QString_const&)>
              (in_stack_fffffffffffffe60,(offset_in_QLineEdit_to_subr)in_RDI,
               (ContextType *)CONCAT44(uVar5,in_stack_fffffffffffffe58),in_stack_fffffffffffffe50,
               (ConnectionType)in_stack_fffffffffffffea0);
    type = (ConnectionType)((ulong)in_stack_fffffffffffffe60 >> 0x20);
    QMetaObject::Connection::~Connection((Connection *)c);
    receiverPrivate = QComboBoxPrivate::updateMicroFocus;
    local_c0._8_8_ = QComboBoxPrivate::updateMicroFocus;
    uStack_b0._0_1_ = (QPaintDevice)0x0;
    uStack_b0._1_7_ = 0;
    this_04 = (QComboBox *)local_a8;
    QObjectPrivate::connect<void(QLineEdit::*)(int,int),void(QComboBoxPrivate::*)()>
              ((Object *)sender,in_stack_fffffffffffffea0,
               (Object *)QComboBoxPrivate::updateMicroFocus,in_stack_fffffffffffffe90,type);
    QMetaObject::Connection::~Connection((Connection *)this_04);
    signal = QLineEdit::selectionChanged;
    uStack_c8 = 0;
    w = (QWidget *)local_c0;
    local_d0 = (Object *)receiverPrivate;
    QObjectPrivate::connect<void(QLineEdit::*)(),void(QComboBoxPrivate::*)()>
              ((Object *)sender,(offset_in_QLineEdit_to_subr)QLineEdit::selectionChanged,
               (Object *)receiverPrivate,in_stack_fffffffffffffe90,
               (ConnectionType)((ulong)w >> 0x20));
    QMetaObject::Connection::~Connection((Connection *)w);
    QLineEdit::d_func((QLineEdit *)0x5388a5);
    this_01 = (QLineEdit *)0x0;
    this_05 = (Object *)receiverPrivate;
    QObjectPrivate::connect<void(QWidgetLineControl::*)(),void(QComboBoxPrivate::*)()>
              (sender,(offset_in_QWidgetLineControl_to_subr)signal,(Object *)receiverPrivate,
               (Function)QWidgetLineControl::updateMicroFocus,(ConnectionType)((ulong)w >> 0x20));
    QMetaObject::Connection::~Connection(&local_d8);
    QLineEdit::setFrame((QLineEdit *)in_stack_fffffffffffffe20,
                        SUB41(in_stack_fffffffffffffe1c >> 0x18,0));
    QWidget::setContextMenuPolicy(&this_00->lineEdit->super_QWidget,NoContextMenu);
    QComboBoxPrivate::updateFocusPolicy(this_00);
    QWidget::setFocusProxy((QWidget *)this_05,w);
    QWidget::setAttribute
              (this_06,(WidgetAttribute)((ulong)sender >> 0x20),SUB81((ulong)sender >> 0x18,0));
    pQVar4 = QLineEdit::completer(this_01);
    if (pQVar4 == (QCompleter *)0x0) {
      in_stack_fffffffffffffe20 = (QWidget *)operator_new(0x10);
      QCompleter::QCompleter(this_02,model,(QObject *)in_stack_fffffffffffffe20);
      QCompleter::setCaseSensitivity
                ((QCompleter *)this_01,(CaseSensitivity)((ulong)receiverPrivate >> 0x20));
      QCompleter::setCompletionMode
                ((QCompleter *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      QCompleter::setCompletionColumn
                ((QCompleter *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      setCompleter(this_04,c);
    }
    QWidget::setAttribute
              (this_06,(WidgetAttribute)((ulong)sender >> 0x20),SUB81((ulong)sender >> 0x18,0));
    QComboBoxPrivate::updateLayoutDirection
              ((QComboBoxPrivate *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    QComboBoxPrivate::updateLineEditGeometry(this_03);
    bVar1 = QWidget::isVisible((QWidget *)0x538a83);
    if (bVar1) {
      QWidget::show(in_stack_fffffffffffffe20);
    }
    QWidget::update((QWidget *)receiverPrivate);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::setLineEdit(QLineEdit *edit)
{
    Q_D(QComboBox);
    if (Q_UNLIKELY(!edit)) {
        qWarning("QComboBox::setLineEdit: cannot set a 0 line edit");
        return;
    }

    if (edit == d->lineEdit)
        return;

    edit->setText(currentText());
    delete d->lineEdit;

    d->lineEdit = edit;
#ifndef QT_NO_IM
    qt_widget_private(d->lineEdit)->inheritsInputMethodHints = 1;
#endif
    if (d->lineEdit->parent() != this)
        d->lineEdit->setParent(this);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::returnPressed,
                            d, &QComboBoxPrivate::returnPressed);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::editingFinished,
                            d, &QComboBoxPrivate::editingFinished);
    connect(d->lineEdit, &QLineEdit::textChanged, this, &QComboBox::editTextChanged);
    connect(d->lineEdit, &QLineEdit::textChanged, this, &QComboBox::currentTextChanged);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::cursorPositionChanged,
                            d, &QComboBoxPrivate::updateMicroFocus);
    QObjectPrivate::connect(d->lineEdit, &QLineEdit::selectionChanged,
                            d, &QComboBoxPrivate::updateMicroFocus);
    QObjectPrivate::connect(d->lineEdit->d_func()->control, &QWidgetLineControl::updateMicroFocus,
                            d, &QComboBoxPrivate::updateMicroFocus);
    d->lineEdit->setFrame(false);
    d->lineEdit->setContextMenuPolicy(Qt::NoContextMenu);
    d->updateFocusPolicy();
    d->lineEdit->setFocusProxy(this);
    d->lineEdit->setAttribute(Qt::WA_MacShowFocusRect, false);

#if QT_CONFIG(completer)
    // create a default completer
    if (!d->lineEdit->completer()) {
        QCompleter *completer = new QCompleter(d->model, d->lineEdit);
        completer->setCaseSensitivity(Qt::CaseInsensitive);
        completer->setCompletionMode(QCompleter::InlineCompletion);
        completer->setCompletionColumn(d->modelColumn);

#ifdef QT_KEYPAD_NAVIGATION
        // Editable combo boxes will have a completer that is set to UnfilteredPopupCompletion.
        // This means that when the user enters edit mode they are immediately presented with a
        // list of possible completions.
        if (QApplicationPrivate::keypadNavigationEnabled())
            completer->setCompletionMode(QCompleter::UnfilteredPopupCompletion);
#endif
        // sets up connections
        setCompleter(completer);
    }
#endif

    setAttribute(Qt::WA_InputMethodEnabled);
    d->updateLayoutDirection();
    d->updateLineEditGeometry();
    if (isVisible())
        d->lineEdit->show();

    update();
}